

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O2

ssize_t __thiscall
jpgd::jpeg_decoder_mem_stream::read
          (jpeg_decoder_mem_stream *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  uint8 *puVar2;
  ulong uVar3;
  undefined4 in_register_00000034;
  uint uVar4;
  
  uVar3 = (ulong)__buf & 0xffffffff;
  *(undefined1 *)__nbytes = 0;
  puVar2 = this->m_pSrc_data;
  if (puVar2 == (uint8 *)0x0) {
    uVar3 = 0xffffffffffffffff;
  }
  else {
    uVar1 = this->m_ofs;
    uVar4 = this->m_size - uVar1;
    if (uVar4 < (uint)__buf) {
      *(undefined1 *)__nbytes = 1;
      puVar2 = this->m_pSrc_data;
      uVar1 = this->m_ofs;
      uVar3 = (ulong)uVar4;
    }
    memcpy((void *)CONCAT44(in_register_00000034,__fd),puVar2 + uVar1,(long)(int)uVar3);
    this->m_ofs = this->m_ofs + (int)uVar3;
  }
  return uVar3 & 0xffffffff;
}

Assistant:

int jpeg_decoder_mem_stream::read(uint8* pBuf, int max_bytes_to_read, bool* pEOF_flag) {
  *pEOF_flag = false;

  if (!m_pSrc_data)
    return -1;

  uint bytes_remaining = m_size - m_ofs;
  if ((uint)max_bytes_to_read > bytes_remaining) {
    max_bytes_to_read = bytes_remaining;
    *pEOF_flag = true;
  }

  memcpy(pBuf, m_pSrc_data + m_ofs, max_bytes_to_read);
  m_ofs += max_bytes_to_read;

  return max_bytes_to_read;
}